

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codaeval.c
# Opt level: O0

int eval_expression(coda_cursor *cursor)

{
  int iVar1;
  undefined4 *puVar2;
  undefined8 uVar3;
  char *pcVar4;
  int local_60 [2];
  long length;
  char *value_3;
  double value_2;
  char s [21];
  undefined8 local_28;
  int64_t value_1;
  coda_cursor *pcStack_18;
  int value;
  coda_cursor *cursor_local;
  
  pcStack_18 = cursor;
  switch(expr_type) {
  case coda_expression_boolean:
    iVar1 = coda_expression_eval_bool(eval_expr,cursor,(long)&value_1 + 4);
    if (iVar1 != 0) {
      puVar2 = (undefined4 *)coda_get_errno();
      uVar3 = coda_errno_to_string(*puVar2);
      coda_set_error(0xfffffe6f,"cannot evaluate boolean expression (%s)",uVar3);
      return -1;
    }
    pcVar4 = "false";
    if (value_1._4_4_ != 0) {
      pcVar4 = "true";
    }
    printf("%s\n",pcVar4);
    break;
  case coda_expression_integer:
    iVar1 = coda_expression_eval_integer(eval_expr,cursor,&local_28);
    if (iVar1 != 0) {
      puVar2 = (undefined4 *)coda_get_errno();
      uVar3 = coda_errno_to_string(*puVar2);
      coda_set_error(0xfffffe6f,"cannot evaluate integer expression (%s)",uVar3);
      return -1;
    }
    coda_str64(local_28,&value_2);
    printf("%s\n",&value_2);
    break;
  case coda_expression_float:
    iVar1 = coda_expression_eval_float(eval_expr,cursor,&value_3);
    if (iVar1 != 0) {
      puVar2 = (undefined4 *)coda_get_errno();
      uVar3 = coda_errno_to_string(*puVar2);
      coda_set_error(0xfffffe6f,"cannot evaluate floating point expression (%s)",uVar3);
      return -1;
    }
    printf("%.16g\n",value_3);
    break;
  case coda_expression_string:
    length = 0;
    iVar1 = coda_expression_eval_string(eval_expr,cursor,&length,local_60);
    if (iVar1 != 0) {
      puVar2 = (undefined4 *)coda_get_errno();
      uVar3 = coda_errno_to_string(*puVar2);
      coda_set_error(0xfffffe6f,"cannot evaluate string expression (%s)",uVar3);
      return -1;
    }
    generate_escaped_string((char *)length,local_60[0]);
    printf("\n");
    if (length != 0) {
      free((void *)length);
    }
    break;
  case coda_expression_node:
  case coda_expression_void:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/tools/codaeval/codaeval.c"
                  ,0xe6,"int eval_expression(coda_cursor *)");
  }
  return 0;
}

Assistant:

static int eval_expression(coda_cursor *cursor)
{
    switch (expr_type)
    {
        case coda_expression_boolean:  /* boolean */
            {
                int value;

                if (coda_expression_eval_bool(eval_expr, cursor, &value))
                {
                    coda_set_error(CODA_ERROR_EXPRESSION, "cannot evaluate boolean expression (%s)",
                                   coda_errno_to_string(coda_errno));
                    return -1;
                }
                printf("%s\n", (value ? "true" : "false"));
            }
            break;
        case coda_expression_integer:  /* integer */
            {
                int64_t value;
                char s[21];

                if (coda_expression_eval_integer(eval_expr, cursor, &value))
                {
                    coda_set_error(CODA_ERROR_EXPRESSION, "cannot evaluate integer expression (%s)",
                                   coda_errno_to_string(coda_errno));
                    return -1;
                }
                coda_str64(value, s);
                printf("%s\n", s);
            }
            break;
        case coda_expression_float:    /* floating point */
            {
                double value;

                if (coda_expression_eval_float(eval_expr, cursor, &value))
                {
                    coda_set_error(CODA_ERROR_EXPRESSION, "cannot evaluate floating point expression (%s)",
                                   coda_errno_to_string(coda_errno));
                    return -1;
                }
                printf("%.16g\n", value);
            }
            break;
        case coda_expression_string:   /* string */
            {
                char *value = NULL;
                long length;

                if (coda_expression_eval_string(eval_expr, cursor, &value, &length))
                {
                    coda_set_error(CODA_ERROR_EXPRESSION, "cannot evaluate string expression (%s)",
                                   coda_errno_to_string(coda_errno));
                    return -1;
                }
                generate_escaped_string(value, length);
                printf("\n");
                if (value != NULL)
                {
                    free(value);
                }
            }
            break;
        case coda_expression_void:
        case coda_expression_node:
            assert(0);
            exit(1);
    }

    return 0;
}